

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo_commands.cpp
# Opt level: O2

void __thiscall
CommandHasWeaponPiece::Parse(CommandHasWeaponPiece *this,FScanner *sc,bool fullScreenOffsets)

{
  bool bVar1;
  uint uVar2;
  PClass *ti;
  
  bVar1 = FScanner::CheckToken(sc,0x102);
  if (!bVar1) {
    FScanner::MustGetToken(sc,0x101);
  }
  ti = PClass::FindClass(sc->String);
  this->weapon = ti;
  if (ti != (PClass *)0x0) {
    bVar1 = PClass::IsAncestorOf(AWeapon::RegistrationInfo.MyClass,ti);
    if (bVar1) goto LAB_00576ce5;
  }
  FScanner::ScriptMessage(sc,"%s is not a kind of weapon.",sc->String);
  this->weapon = AWeapon::RegistrationInfo.MyClass;
LAB_00576ce5:
  FScanner::MustGetToken(sc,0x2c);
  FScanner::MustGetToken(sc,0x104);
  uVar2 = sc->Number;
  if ((int)uVar2 < 1) {
    FScanner::ScriptError(sc,"Weapon piece number can not be less than 1.");
    uVar2 = sc->Number;
  }
  this->piece = uVar2;
  SBarInfoCommandFlowControl::Parse(&this->super_SBarInfoCommandFlowControl,sc,fullScreenOffsets);
  return;
}

Assistant:

void	Parse(FScanner &sc, bool fullScreenOffsets)
		{
			if(!sc.CheckToken(TK_StringConst))
				sc.MustGetToken(TK_Identifier);
			weapon = PClass::FindClass(sc.String);
			if(weapon == NULL || !RUNTIME_CLASS(AWeapon)->IsAncestorOf(weapon)) //must be a weapon
			{
				sc.ScriptMessage("%s is not a kind of weapon.", sc.String);
				weapon = RUNTIME_CLASS(AWeapon);
			}
			sc.MustGetToken(',');
			sc.MustGetToken(TK_IntConst);
			if(sc.Number < 1)
				sc.ScriptError("Weapon piece number can not be less than 1.");
			piece = sc.Number;
			SBarInfoCommandFlowControl::Parse(sc, fullScreenOffsets);
		}